

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

ssize_t Bcj2_Decode(_7zip *zip,uint8_t *outBuf,size_t outSize)

{
  byte bVar1;
  uchar uVar2;
  ushort uVar3;
  size_t sVar4;
  uchar *puVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uchar *puVar9;
  size_t sVar10;
  uint8_t local_c4 [4];
  byte *pbStack_c0;
  uint8_t out [4];
  uint8_t *v;
  uint32_t dest;
  uint8_t bb;
  size_t limit;
  uint32_t ttt;
  uint32_t bound;
  uint16_t *prob;
  uint8_t b;
  int ii;
  uint j;
  uint i;
  uint8_t *bufferLim;
  uint8_t *buffer;
  size_t size3;
  size_t size2;
  size_t size1;
  size_t size0;
  uint8_t *buf3;
  uint8_t *buf2;
  uint8_t *buf1;
  uint8_t *buf0;
  size_t outPos;
  size_t inPos;
  size_t outSize_local;
  uint8_t *outBuf_local;
  _7zip *zip_local;
  
  outPos = 0;
  buf0 = (uint8_t *)0x0;
  sVar4 = zip->tmp_stream_bytes_remaining;
  puVar5 = zip->tmp_stream_buff;
  lVar6 = zip->tmp_stream_bytes_avail - sVar4;
  size2 = zip->sub_stream_bytes_remaining[0];
  buf2 = zip->sub_stream_buff[0] + (zip->sub_stream_size[0] - size2);
  size3 = zip->sub_stream_bytes_remaining[1];
  buf3 = zip->sub_stream_buff[1] + (zip->sub_stream_size[1] - size3);
  bufferLim = zip->sub_stream_buff[2] +
              (zip->sub_stream_size[2] - zip->sub_stream_bytes_remaining[2]);
  puVar9 = bufferLim + zip->sub_stream_bytes_remaining[2];
  if (zip->bcj_state == 0) {
    zip->bcj2_prevByte = '\0';
    for (ii = 0; (uint)ii < 0x102; ii = ii + 1) {
      zip->bcj2_p[(uint)ii] = 0x400;
    }
    zip->bcj2_code = 0;
    zip->bcj2_range = 0xffffffff;
    for (prob._4_4_ = 0; prob._4_4_ < 5; prob._4_4_ = prob._4_4_ + 1) {
      if (bufferLim == puVar9) {
        return -0x19;
      }
      zip->bcj2_code = zip->bcj2_code << 8 | (uint)*bufferLim;
      bufferLim = bufferLim + 1;
    }
    zip->bcj_state = 1;
  }
  ii = 0;
  while (zip->odd_bcj_size != 0 && buf0 < outSize) {
    outBuf[(long)buf0] = zip->odd_bcj[(uint)ii];
    zip->odd_bcj_size = zip->odd_bcj_size - 1;
    ii = ii + 1;
    buf0 = buf0 + 1;
  }
  if (outSize == 0) {
    zip->bcj2_outPos = (uint64_t)(buf0 + zip->bcj2_outPos);
    zip_local = (_7zip *)buf0;
  }
  else {
LAB_0020de03:
    do {
      _dest = sVar4 - outPos;
      if (outSize - (long)buf0 < _dest) {
        _dest = outSize - (long)buf0;
      }
      if (zip->bcj_state == 1) {
        for (; _dest != 0; _dest = _dest - 1) {
          bVar1 = puVar5[outPos + lVar6];
          outBuf[(long)buf0] = bVar1;
          if (((bVar1 & 0xfe) == 0xe8) ||
             ((zip->bcj2_prevByte == '\x0f' && ((bVar1 & 0xf0) == 0x80)))) {
            zip->bcj_state = 2;
            buf0 = buf0 + 1;
            break;
          }
          outPos = outPos + 1;
          zip->bcj2_prevByte = bVar1;
          buf0 = buf0 + 1;
        }
      }
      if ((_dest == 0) || (buf0 == (uint8_t *)outSize)) goto LAB_0020e356;
      zip->bcj_state = 1;
      sVar10 = outPos + 1;
      uVar2 = puVar5[outPos + lVar6];
      if (uVar2 == 0xe8) {
        _ttt = zip->bcj2_p + (int)(uint)zip->bcj2_prevByte;
      }
      else if (uVar2 == 0xe9) {
        _ttt = zip->bcj2_p + 0x100;
      }
      else {
        _ttt = zip->bcj2_p + 0x101;
      }
      uVar3 = *_ttt;
      uVar7 = (zip->bcj2_range >> 0xb) * (uint)uVar3;
      outPos = sVar10;
      if (zip->bcj2_code < uVar7) {
        zip->bcj2_range = uVar7;
        *_ttt = uVar3 + (short)(0x800 - uVar3 >> 5);
        if (zip->bcj2_range < 0x1000000) {
          if (bufferLim == puVar9) {
            return -0x19;
          }
          zip->bcj2_range = zip->bcj2_range << 8;
          zip->bcj2_code = zip->bcj2_code << 8 | (uint)*bufferLim;
          bufferLim = bufferLim + 1;
        }
        zip->bcj2_prevByte = uVar2;
        goto LAB_0020de03;
      }
      zip->bcj2_range = zip->bcj2_range - uVar7;
      zip->bcj2_code = zip->bcj2_code - uVar7;
      *_ttt = uVar3 - (uVar3 >> 5);
      if (zip->bcj2_range < 0x1000000) {
        if (bufferLim == puVar9) {
          return -0x19;
        }
        zip->bcj2_range = zip->bcj2_range << 8;
        zip->bcj2_code = zip->bcj2_code << 8 | (uint)*bufferLim;
        bufferLim = bufferLim + 1;
      }
      if (uVar2 == 0xe8) {
        pbStack_c0 = buf2;
        if (size2 < 4) {
          return -0x19;
        }
        buf2 = buf2 + 4;
        size2 = size2 - 4;
      }
      else {
        pbStack_c0 = buf3;
        if (size3 < 4) {
          return -0x19;
        }
        buf3 = buf3 + 4;
        size3 = size3 - 4;
      }
      iVar8 = ((uint)*pbStack_c0 << 0x18 | (uint)pbStack_c0[1] << 0x10 | (uint)pbStack_c0[2] << 8 |
              (uint)pbStack_c0[3]) - ((int)zip->bcj2_outPos + (int)buf0 + 4);
      local_c4[0] = (uint8_t)iVar8;
      local_c4[1] = (char)((uint)iVar8 >> 8);
      local_c4[2] = (char)((uint)iVar8 >> 0x10);
      local_c4[3] = (uint8_t)((uint)iVar8 >> 0x18);
      zip->bcj2_prevByte = local_c4[3];
      for (ii = 0; (uint)ii < 4 && buf0 < outSize; ii = ii + 1) {
        outBuf[(long)buf0] = local_c4[(uint)ii];
        buf0 = buf0 + 1;
      }
    } while (3 < (uint)ii);
    zip->odd_bcj_size = (ulong)(4 - ii);
    for (; (uint)ii < 4; ii = ii + 1) {
      zip->odd_bcj[(uint)(ii + -4 + (int)zip->odd_bcj_size)] = local_c4[(uint)ii];
    }
LAB_0020e356:
    zip->tmp_stream_bytes_remaining = zip->tmp_stream_bytes_remaining - outPos;
    zip->sub_stream_bytes_remaining[0] = size2;
    zip->sub_stream_bytes_remaining[1] = size3;
    zip->sub_stream_bytes_remaining[2] = (long)puVar9 - (long)bufferLim;
    zip->bcj2_outPos = (uint64_t)(buf0 + zip->bcj2_outPos);
    zip_local = (_7zip *)buf0;
  }
  return (ssize_t)zip_local;
}

Assistant:

static ssize_t
Bcj2_Decode(struct _7zip *zip, uint8_t *outBuf, size_t outSize)
{
	size_t inPos = 0, outPos = 0;
	const uint8_t *buf0, *buf1, *buf2, *buf3;
	size_t size0, size1, size2, size3;
	const uint8_t *buffer, *bufferLim;
	unsigned int i, j;

	size0 = zip->tmp_stream_bytes_remaining;
	buf0 = zip->tmp_stream_buff + zip->tmp_stream_bytes_avail - size0;
	size1 = zip->sub_stream_bytes_remaining[0];
	buf1 = zip->sub_stream_buff[0] + zip->sub_stream_size[0] - size1;
	size2 = zip->sub_stream_bytes_remaining[1];
	buf2 = zip->sub_stream_buff[1] + zip->sub_stream_size[1] - size2;
	size3 = zip->sub_stream_bytes_remaining[2];
	buf3 = zip->sub_stream_buff[2] + zip->sub_stream_size[2] - size3;

	buffer = buf3;
	bufferLim = buffer + size3;

	if (zip->bcj_state == 0) {
		/*
		 * Initialize.
		 */
		zip->bcj2_prevByte = 0;
		for (i = 0;
		    i < sizeof(zip->bcj2_p) / sizeof(zip->bcj2_p[0]); i++)
			zip->bcj2_p[i] = kBitModelTotal >> 1;
		RC_INIT2;
		zip->bcj_state = 1;
	}

	/*
	 * Gather the odd bytes of a previous call.
	 */
	for (i = 0; zip->odd_bcj_size > 0 && outPos < outSize; i++) {
		outBuf[outPos++] = zip->odd_bcj[i];
		zip->odd_bcj_size--;
	}

	if (outSize == 0) {
		zip->bcj2_outPos += outPos;
		return (outPos);
	}

	for (;;) {
		uint8_t b;
		CProb *prob;
		uint32_t bound;
		uint32_t ttt;

		size_t limit = size0 - inPos;
		if (outSize - outPos < limit)
			limit = outSize - outPos;

		if (zip->bcj_state == 1) {
			while (limit != 0) {
				uint8_t bb = buf0[inPos];
				outBuf[outPos++] = bb;
				if (IsJ(zip->bcj2_prevByte, bb)) {
					zip->bcj_state = 2;
					break;
				}
				inPos++;
				zip->bcj2_prevByte = bb;
				limit--;
			}
		}

		if (limit == 0 || outPos == outSize)
			break;
		zip->bcj_state = 1;

		b = buf0[inPos++];

		if (b == 0xE8)
			prob = zip->bcj2_p + zip->bcj2_prevByte;
		else if (b == 0xE9)
			prob = zip->bcj2_p + 256;
		else
			prob = zip->bcj2_p + 257;

		IF_BIT_0(prob) {
			UPDATE_0(prob)
			zip->bcj2_prevByte = b;
		} else {
			uint32_t dest;
			const uint8_t *v;
			uint8_t out[4];

			UPDATE_1(prob)
			if (b == 0xE8) {
				v = buf1;
				if (size1 < 4)
					return SZ_ERROR_DATA;
				buf1 += 4;
				size1 -= 4;
			} else {
				v = buf2;
				if (size2 < 4)
					return SZ_ERROR_DATA;
				buf2 += 4;
				size2 -= 4;
			}
			dest = (((uint32_t)v[0] << 24) |
			    ((uint32_t)v[1] << 16) |
			    ((uint32_t)v[2] << 8) |
			    ((uint32_t)v[3])) -
			    ((uint32_t)zip->bcj2_outPos + (uint32_t)outPos + 4);
			out[0] = (uint8_t)dest;
			out[1] = (uint8_t)(dest >> 8);
			out[2] = (uint8_t)(dest >> 16);
			out[3] = zip->bcj2_prevByte = (uint8_t)(dest >> 24);

			for (i = 0; i < 4 && outPos < outSize; i++)
				outBuf[outPos++] = out[i];
			if (i < 4) {
				/*
				 * Save odd bytes which we could not add into
				 * the output buffer because of out of space.
				 */
				zip->odd_bcj_size = 4 -i;
				for (; i < 4; i++) {
					j = i - 4 + (unsigned)zip->odd_bcj_size;
					zip->odd_bcj[j] = out[i];
				}
				break;
			}
		}
	}